

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_any.hpp
# Opt level: O2

void __thiscall
iutest::any::
holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~holder
          (holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  std::__cxx11::string::~string((string *)&this->held);
  operator_delete(this,0x28);
  return;
}

Assistant:

class holder IUTEST_CXX_FINAL : public placeholder
    {
    public:
        explicit holder(const T& v) : held(v) {}
    public:
        virtual type_id type() const IUTEST_CXX_OVERRIDE
        {
            return internal::GetTypeId<T>();
        }